

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_get_chrm(spng_ctx *ctx,spng_chrm *chrm)

{
  int ret;
  spng_chrm *chrm_local;
  spng_ctx *ctx_local;
  
  if (ctx == (spng_ctx *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    ctx_local._4_4_ = read_chunks(ctx,0);
    if (ctx_local._4_4_ == 0) {
      if (((uint)ctx->stored >> 2 & 1) == 0) {
        ctx_local._4_4_ = 0x49;
      }
      else if (chrm == (spng_chrm *)0x0) {
        ctx_local._4_4_ = 1;
      }
      else {
        chrm->white_point_x = (double)(ctx->chrm_int).white_point_x / 100000.0;
        chrm->white_point_y = (double)(ctx->chrm_int).white_point_y / 100000.0;
        chrm->red_x = (double)(ctx->chrm_int).red_x / 100000.0;
        chrm->red_y = (double)(ctx->chrm_int).red_y / 100000.0;
        chrm->blue_y = (double)(ctx->chrm_int).blue_y / 100000.0;
        chrm->blue_x = (double)(ctx->chrm_int).blue_x / 100000.0;
        chrm->green_x = (double)(ctx->chrm_int).green_x / 100000.0;
        chrm->green_y = (double)(ctx->chrm_int).green_y / 100000.0;
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_get_chrm(spng_ctx *ctx, struct spng_chrm *chrm)
{
    SPNG_GET_CHUNK_BOILERPLATE(chrm);

    chrm->white_point_x = (double)ctx->chrm_int.white_point_x / 100000.0;
    chrm->white_point_y = (double)ctx->chrm_int.white_point_y / 100000.0;
    chrm->red_x = (double)ctx->chrm_int.red_x / 100000.0;
    chrm->red_y = (double)ctx->chrm_int.red_y / 100000.0;
    chrm->blue_y = (double)ctx->chrm_int.blue_y / 100000.0;
    chrm->blue_x = (double)ctx->chrm_int.blue_x / 100000.0;
    chrm->green_x = (double)ctx->chrm_int.green_x / 100000.0;
    chrm->green_y = (double)ctx->chrm_int.green_y / 100000.0;

    return 0;
}